

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultUnfoundedCheck::assertAtom(DefaultUnfoundedCheck *this,Literal a,UfsType t)

{
  bool bVar1;
  size_type sVar2;
  Var VVar3;
  reference pLVar4;
  uint32 in_ESI;
  DefaultUnfoundedCheck *in_RDI;
  Result RVar5;
  DefaultUnfoundedCheck *unaff_retaddr;
  bool noClause;
  bool tainted;
  Literal *in_stack_ffffffffffffff58;
  Literal *in_stack_ffffffffffffff60;
  Solver *in_stack_ffffffffffffff68;
  LitVec *first;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff70;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  Solver *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  uint32 flags;
  undefined5 in_stack_ffffffffffffff88;
  byte in_stack_ffffffffffffff8d;
  byte bVar6;
  undefined1 uVar7;
  Solver *in_stack_ffffffffffffff90;
  Result local_50;
  uint32 local_3c;
  Antecedent local_38;
  uint32 local_2c;
  uint32 local_28;
  byte local_22;
  byte local_21;
  uint32 local_20;
  uint32 local_1c;
  DefaultUnfoundedCheck *this_01;
  Literal local_8;
  UfsType in_stack_fffffffffffffffc;
  
  flags = (uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_01 = in_RDI;
  local_8.rep_ = in_ESI;
  bVar1 = Solver::isTrue(in_stack_ffffffffffffff68,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (((bVar1) || (in_RDI->strategy_ == distinct_reason)) ||
     (bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                        (&in_RDI->activeClause_), bVar1)) {
    bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                      (&in_RDI->loopAtoms_);
    if (!bVar1) {
      createLoopFormula(this_01);
    }
    in_stack_ffffffffffffff90 = (Solver *)&in_RDI->activeClause_;
    local_1c = (uint32)Literal::operator~(in_stack_ffffffffffffff58);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign
              (in_stack_ffffffffffffff70,(size_type)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               in_stack_ffffffffffffff60);
    computeReason(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  local_20 = (uint32)Literal::operator~(in_stack_ffffffffffffff58);
  pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (&in_RDI->activeClause_,0);
  pLVar4->rep_ = local_20;
  bVar1 = ConstraintInfo::tagged((ConstraintInfo *)0x21097d);
  uVar7 = true;
  if (!bVar1) {
    uVar7 = ConstraintInfo::aux((ConstraintInfo *)in_stack_ffffffffffffff60);
  }
  local_28 = local_8.rep_;
  local_21 = uVar7;
  bVar1 = Solver::isTrue(in_stack_ffffffffffffff68,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  bVar6 = 1;
  if (((!bVar1) && (bVar6 = 1, in_RDI->strategy_ != no_reason)) &&
     ((bVar6 = 1, in_RDI->strategy_ != only_reason &&
      (in_stack_ffffffffffffff8d = 0, bVar6 = in_stack_ffffffffffffff8d,
      in_RDI->strategy_ == shared_reason)))) {
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                      (&in_RDI->activeClause_);
    in_stack_ffffffffffffff8d = 0;
    bVar6 = in_stack_ffffffffffffff8d;
    if (3 < sVar2) {
      in_stack_ffffffffffffff8d = local_21 ^ 0xff;
      bVar6 = in_stack_ffffffffffffff8d;
    }
  }
  local_22 = bVar6 & 1;
  if (local_22 == 0) {
    RVar5 = ClauseCreator::create
                      (in_stack_ffffffffffffff90,
                       (LitVec *)
                       CONCAT17(uVar7,CONCAT16(bVar6,CONCAT15(in_stack_ffffffffffffff8d,
                                                              in_stack_ffffffffffffff88))),flags,
                       (ConstraintInfo *)in_stack_ffffffffffffff78);
    local_50.local = RVar5.local;
    local_50.status = RVar5.status;
    bVar1 = ClauseCreator::Result::ok(&local_50);
  }
  else {
    local_2c = (uint32)Literal::operator~(in_stack_ffffffffffffff58);
    Antecedent::Antecedent(&local_38,(Constraint *)in_RDI);
    bVar1 = Solver::force(in_stack_ffffffffffffff78,(Literal *)in_stack_ffffffffffffff70,
                          (Antecedent *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (in_RDI->strategy_ == only_reason) {
        first = in_RDI->reasons_;
        VVar3 = Literal::var(&local_8);
        this_00 = first + (VVar3 - 1);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                  (&in_RDI->activeClause_);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                  (&in_RDI->activeClause_);
        bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::assign<Clasp::Literal*>
                  (this_00,(Literal *)first,in_stack_ffffffffffffff60);
      }
      else if (in_RDI->strategy_ != no_reason) {
        local_3c = (uint32)Literal::operator~(in_stack_ffffffffffffff58);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (in_stack_ffffffffffffff70,(Literal *)in_stack_ffffffffffffff68);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool DefaultUnfoundedCheck::assertAtom(Literal a, UfsType t) {
	if (solver_->isTrue(a) || strategy_ == distinct_reason || activeClause_.empty()) {
		// Conflict, first atom of unfounded set, or distinct reason for each atom requested -
		// compute reason for a being unfounded.
		// We must flush any not yet created loop formula here - the
		// atoms in loopAtoms_ depend on the current reason which is about to be replaced.
		if (!loopAtoms_.empty()) {
			createLoopFormula();
		}
		activeClause_.assign(1, ~a);
		computeReason(t);
	}
	activeClause_[0] = ~a;
	bool tainted = info_.tagged() || info_.aux();
	bool noClause = solver_->isTrue(a) || strategy_ == no_reason || strategy_ == only_reason || (strategy_ == shared_reason && activeClause_.size() > 3 && !tainted);
	if (noClause) {
		if (!solver_->force(~a, this))  { return false; }
		if (strategy_ == only_reason)   { reasons_[a.var()-1].assign(activeClause_.begin()+1, activeClause_.end()); }
		else if (strategy_ != no_reason){ loopAtoms_.push_back(~a); }
		return true;
	}
	else { // learn nogood and assert ~a
		return ClauseCreator::create(*solver_, activeClause_, ClauseCreator::clause_no_prepare, info_).ok();
	}
}